

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglstreamconvenience.cpp
# Opt level: O2

void __thiscall QEGLStreamConvenience::initialize(QEGLStreamConvenience *this,EGLDisplay dpy)

{
  int iVar1;
  char *pcVar2;
  PFNEGLCREATESTREAMKHRPROC p_Var3;
  PFNEGLDESTROYSTREAMKHRPROC p_Var4;
  PFNEGLSTREAMATTRIBKHRPROC p_Var5;
  PFNEGLQUERYSTREAMKHRPROC p_Var6;
  PFNEGLQUERYSTREAMU64KHRPROC p_Var7;
  PFNEGLCREATESTREAMPRODUCERSURFACEKHRPROC p_Var8;
  PFNEGLSTREAMCONSUMEROUTPUTEXTPROC p_Var9;
  PFNEGLGETOUTPUTLAYERSEXTPROC p_Var10;
  PFNEGLGETOUTPUTPORTSEXTPROC p_Var11;
  PFNEGLOUTPUTLAYERATTRIBEXTPROC p_Var12;
  PFNEGLQUERYOUTPUTLAYERATTRIBEXTPROC p_Var13;
  PFNEGLQUERYOUTPUTLAYERSTRINGEXTPROC p_Var14;
  PFNEGLQUERYOUTPUTPORTATTRIBEXTPROC p_Var15;
  PFNEGLQUERYOUTPUTPORTSTRINGEXTPROC p_Var16;
  PFNEGLGETSTREAMFILEDESCRIPTORKHRPROC p_Var17;
  PFNEGLCREATESTREAMFROMFILEDESCRIPTORKHRPROC p_Var18;
  PFNEGLSTREAMCONSUMERGLTEXTUREEXTERNALKHRPROC p_Var19;
  PFNEGLSTREAMCONSUMERACQUIREKHRPROC p_Var20;
  PFNEGLSTREAMCONSUMERRELEASEKHRPROC p_Var21;
  PFNEGLCREATESTREAMATTRIBNVPROC p_Var22;
  PFNEGLSETSTREAMATTRIBNVPROC p_Var23;
  PFNEGLQUERYSTREAMATTRIBNVPROC p_Var24;
  PFNEGLSTREAMCONSUMERACQUIREATTRIBNVPROC p_Var25;
  PFNEGLSTREAMCONSUMERRELEASEATTRIBNVPROC p_Var26;
  char *pcVar27;
  long in_FS_OFFSET;
  char local_38 [24];
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->initialized == false) {
    iVar1 = eglBindAPI(0x30a0);
    if (iVar1 == 0) {
      pcVar2 = "Failed to bind OpenGL ES API";
    }
    else {
      pcVar2 = (char *)eglQueryString(dpy,0x3055);
      if (pcVar2 != (char *)0x0) {
        p_Var3 = (PFNEGLCREATESTREAMKHRPROC)eglGetProcAddress("eglCreateStreamKHR");
        this->create_stream = p_Var3;
        p_Var4 = (PFNEGLDESTROYSTREAMKHRPROC)eglGetProcAddress("eglDestroyStreamKHR");
        this->destroy_stream = p_Var4;
        p_Var5 = (PFNEGLSTREAMATTRIBKHRPROC)eglGetProcAddress("eglStreamAttribKHR");
        this->stream_attrib = p_Var5;
        p_Var6 = (PFNEGLQUERYSTREAMKHRPROC)eglGetProcAddress("eglQueryStreamKHR");
        this->query_stream = p_Var6;
        p_Var7 = (PFNEGLQUERYSTREAMU64KHRPROC)eglGetProcAddress("eglQueryStreamu64KHR");
        this->query_stream_u64 = p_Var7;
        p_Var8 = (PFNEGLCREATESTREAMPRODUCERSURFACEKHRPROC)
                 eglGetProcAddress("eglCreateStreamProducerSurfaceKHR");
        this->create_stream_producer_surface = p_Var8;
        p_Var9 = (PFNEGLSTREAMCONSUMEROUTPUTEXTPROC)eglGetProcAddress("eglStreamConsumerOutputEXT");
        this->stream_consumer_output = p_Var9;
        p_Var10 = (PFNEGLGETOUTPUTLAYERSEXTPROC)eglGetProcAddress("eglGetOutputLayersEXT");
        this->get_output_layers = p_Var10;
        p_Var11 = (PFNEGLGETOUTPUTPORTSEXTPROC)eglGetProcAddress("eglGetOutputPortsEXT");
        this->get_output_ports = p_Var11;
        p_Var12 = (PFNEGLOUTPUTLAYERATTRIBEXTPROC)eglGetProcAddress("eglOutputLayerAttribEXT");
        this->output_layer_attrib = p_Var12;
        p_Var13 = (PFNEGLQUERYOUTPUTLAYERATTRIBEXTPROC)
                  eglGetProcAddress("eglQueryOutputLayerAttribEXT");
        this->query_output_layer_attrib = p_Var13;
        p_Var14 = (PFNEGLQUERYOUTPUTLAYERSTRINGEXTPROC)
                  eglGetProcAddress("eglQueryOutputLayerStringEXT");
        this->query_output_layer_string = p_Var14;
        p_Var15 = (PFNEGLQUERYOUTPUTPORTATTRIBEXTPROC)
                  eglGetProcAddress("eglQueryOutputPortAttribEXT");
        this->query_output_port_attrib = p_Var15;
        p_Var16 = (PFNEGLQUERYOUTPUTPORTSTRINGEXTPROC)
                  eglGetProcAddress("eglQueryOutputPortStringEXT");
        this->query_output_port_string = p_Var16;
        p_Var17 = (PFNEGLGETSTREAMFILEDESCRIPTORKHRPROC)
                  eglGetProcAddress("eglGetStreamFileDescriptorKHR");
        this->get_stream_file_descriptor = p_Var17;
        p_Var18 = (PFNEGLCREATESTREAMFROMFILEDESCRIPTORKHRPROC)
                  eglGetProcAddress("eglCreateStreamFromFileDescriptorKHR");
        this->create_stream_from_file_descriptor = p_Var18;
        p_Var19 = (PFNEGLSTREAMCONSUMERGLTEXTUREEXTERNALKHRPROC)
                  eglGetProcAddress("eglStreamConsumerGLTextureExternalKHR");
        this->stream_consumer_gltexture = p_Var19;
        p_Var20 = (PFNEGLSTREAMCONSUMERACQUIREKHRPROC)
                  eglGetProcAddress("eglStreamConsumerAcquireKHR");
        this->stream_consumer_acquire = p_Var20;
        p_Var21 = (PFNEGLSTREAMCONSUMERRELEASEKHRPROC)
                  eglGetProcAddress("eglStreamConsumerReleaseKHR");
        this->stream_consumer_release = p_Var21;
        p_Var22 = (PFNEGLCREATESTREAMATTRIBNVPROC)eglGetProcAddress("eglCreateStreamAttribNV");
        this->create_stream_attrib_nv = p_Var22;
        p_Var23 = (PFNEGLSETSTREAMATTRIBNVPROC)eglGetProcAddress("eglSetStreamAttribNV");
        this->set_stream_attrib_nv = p_Var23;
        p_Var24 = (PFNEGLQUERYSTREAMATTRIBNVPROC)eglGetProcAddress("eglQueryStreamAttribNV");
        this->query_stream_attrib_nv = p_Var24;
        p_Var25 = (PFNEGLSTREAMCONSUMERACQUIREATTRIBNVPROC)
                  eglGetProcAddress("eglStreamConsumerAcquireAttribNV");
        this->acquire_stream_attrib_nv = p_Var25;
        p_Var26 = (PFNEGLSTREAMCONSUMERRELEASEATTRIBNVPROC)
                  eglGetProcAddress("eglStreamConsumerReleaseAttribNV");
        this->release_stream_attrib_nv = p_Var26;
        pcVar27 = strstr(pcVar2,"EGL_KHR_stream");
        this->has_egl_stream = pcVar27 != (char *)0x0;
        pcVar27 = strstr(pcVar2,"EGL_KHR_stream_producer_eglsurface");
        this->has_egl_stream_producer_eglsurface = pcVar27 != (char *)0x0;
        pcVar27 = strstr(pcVar2,"EGL_EXT_stream_consumer_egloutput");
        this->has_egl_stream_consumer_egloutput = pcVar27 != (char *)0x0;
        pcVar27 = strstr(pcVar2,"EGL_EXT_output_drm");
        this->has_egl_output_drm = pcVar27 != (char *)0x0;
        pcVar27 = strstr(pcVar2,"EGL_EXT_output_base");
        this->has_egl_output_base = pcVar27 != (char *)0x0;
        pcVar27 = strstr(pcVar2,"EGL_KHR_stream_cross_process_fd");
        this->has_egl_stream_cross_process_fd = pcVar27 != (char *)0x0;
        pcVar2 = strstr(pcVar2,"EGL_KHR_stream_consumer_gltexture");
        this->has_egl_stream_consumer_gltexture = pcVar2 != (char *)0x0;
        this->initialized = true;
        goto LAB_004f42dc;
      }
      pcVar2 = "Failed to query EGL extensions";
    }
    local_20 = "default";
    local_38[0x14] = '\0';
    local_38[0x15] = '\0';
    local_38[0x16] = '\0';
    local_38[0x17] = '\0';
    local_38[0xc] = '\0';
    local_38[0xd] = '\0';
    local_38[0xe] = '\0';
    local_38[0xf] = '\0';
    local_38[0x10] = '\0';
    local_38[0x11] = '\0';
    local_38[0x12] = '\0';
    local_38[0x13] = '\0';
    local_38[4] = '\0';
    local_38[5] = '\0';
    local_38[6] = '\0';
    local_38[7] = '\0';
    local_38[8] = '\0';
    local_38[9] = '\0';
    local_38[10] = '\0';
    local_38[0xb] = '\0';
    local_38[0] = '\x02';
    local_38[1] = '\0';
    local_38[2] = '\0';
    local_38[3] = '\0';
    QMessageLogger::warning(local_38,pcVar2);
  }
LAB_004f42dc:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEGLStreamConvenience::initialize(EGLDisplay dpy)
{
    if (initialized)
        return;

    if (!eglBindAPI(EGL_OPENGL_ES_API)) {
        qWarning("Failed to bind OpenGL ES API");
        return;
    }

    const char *extensions = eglQueryString(dpy, EGL_EXTENSIONS);
    if (!extensions) {
        qWarning("Failed to query EGL extensions");
        return;
    }

    create_stream = reinterpret_cast<PFNEGLCREATESTREAMKHRPROC>(eglGetProcAddress("eglCreateStreamKHR"));
    destroy_stream = reinterpret_cast<PFNEGLDESTROYSTREAMKHRPROC>(eglGetProcAddress("eglDestroyStreamKHR"));
    stream_attrib = reinterpret_cast<PFNEGLSTREAMATTRIBKHRPROC>(eglGetProcAddress("eglStreamAttribKHR"));
    query_stream = reinterpret_cast<PFNEGLQUERYSTREAMKHRPROC>(eglGetProcAddress("eglQueryStreamKHR"));
    query_stream_u64 = reinterpret_cast<PFNEGLQUERYSTREAMU64KHRPROC>(eglGetProcAddress("eglQueryStreamu64KHR"));
    create_stream_producer_surface = reinterpret_cast<PFNEGLCREATESTREAMPRODUCERSURFACEKHRPROC>(eglGetProcAddress("eglCreateStreamProducerSurfaceKHR"));
    stream_consumer_output = reinterpret_cast<PFNEGLSTREAMCONSUMEROUTPUTEXTPROC>(eglGetProcAddress("eglStreamConsumerOutputEXT"));
    get_output_layers = reinterpret_cast<PFNEGLGETOUTPUTLAYERSEXTPROC>(eglGetProcAddress("eglGetOutputLayersEXT"));
    get_output_ports = reinterpret_cast<PFNEGLGETOUTPUTPORTSEXTPROC>(eglGetProcAddress("eglGetOutputPortsEXT"));
    output_layer_attrib = reinterpret_cast<PFNEGLOUTPUTLAYERATTRIBEXTPROC>(eglGetProcAddress("eglOutputLayerAttribEXT"));
    query_output_layer_attrib = reinterpret_cast<PFNEGLQUERYOUTPUTLAYERATTRIBEXTPROC>(eglGetProcAddress("eglQueryOutputLayerAttribEXT"));
    query_output_layer_string = reinterpret_cast<PFNEGLQUERYOUTPUTLAYERSTRINGEXTPROC>(eglGetProcAddress("eglQueryOutputLayerStringEXT"));
    query_output_port_attrib = reinterpret_cast<PFNEGLQUERYOUTPUTPORTATTRIBEXTPROC>(eglGetProcAddress("eglQueryOutputPortAttribEXT"));
    query_output_port_string = reinterpret_cast<PFNEGLQUERYOUTPUTPORTSTRINGEXTPROC>(eglGetProcAddress("eglQueryOutputPortStringEXT"));
    get_stream_file_descriptor = reinterpret_cast<PFNEGLGETSTREAMFILEDESCRIPTORKHRPROC>(eglGetProcAddress("eglGetStreamFileDescriptorKHR"));
    create_stream_from_file_descriptor = reinterpret_cast<PFNEGLCREATESTREAMFROMFILEDESCRIPTORKHRPROC>(eglGetProcAddress("eglCreateStreamFromFileDescriptorKHR"));
    stream_consumer_gltexture = reinterpret_cast<PFNEGLSTREAMCONSUMERGLTEXTUREEXTERNALKHRPROC>(eglGetProcAddress("eglStreamConsumerGLTextureExternalKHR"));
    stream_consumer_acquire = reinterpret_cast<PFNEGLSTREAMCONSUMERACQUIREKHRPROC>(eglGetProcAddress("eglStreamConsumerAcquireKHR"));
    stream_consumer_release = reinterpret_cast<PFNEGLSTREAMCONSUMERRELEASEKHRPROC>(eglGetProcAddress("eglStreamConsumerReleaseKHR"));
    create_stream_attrib_nv = reinterpret_cast<PFNEGLCREATESTREAMATTRIBNVPROC>(eglGetProcAddress("eglCreateStreamAttribNV"));
    set_stream_attrib_nv = reinterpret_cast<PFNEGLSETSTREAMATTRIBNVPROC>(eglGetProcAddress("eglSetStreamAttribNV"));
    query_stream_attrib_nv = reinterpret_cast<PFNEGLQUERYSTREAMATTRIBNVPROC>(eglGetProcAddress("eglQueryStreamAttribNV"));
    acquire_stream_attrib_nv = reinterpret_cast<PFNEGLSTREAMCONSUMERACQUIREATTRIBNVPROC>(eglGetProcAddress("eglStreamConsumerAcquireAttribNV"));
    release_stream_attrib_nv = reinterpret_cast<PFNEGLSTREAMCONSUMERRELEASEATTRIBNVPROC>(eglGetProcAddress("eglStreamConsumerReleaseAttribNV"));

    has_egl_stream = strstr(extensions, "EGL_KHR_stream");
    has_egl_stream_producer_eglsurface = strstr(extensions, "EGL_KHR_stream_producer_eglsurface");
    has_egl_stream_consumer_egloutput = strstr(extensions, "EGL_EXT_stream_consumer_egloutput");
    has_egl_output_drm = strstr(extensions, "EGL_EXT_output_drm");
    has_egl_output_base = strstr(extensions, "EGL_EXT_output_base");
    has_egl_stream_cross_process_fd = strstr(extensions, "EGL_KHR_stream_cross_process_fd");
    has_egl_stream_consumer_gltexture = strstr(extensions, "EGL_KHR_stream_consumer_gltexture");

    initialized = true;
}